

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O1

void nni_posix_udp_doerror(nni_plat_udp *udp,int rv)

{
  nni_aio *aio;
  
  do {
    aio = (nni_aio *)nni_list_first(&udp->udp_recvq);
    if (aio == (nni_aio *)0x0) {
      aio = (nni_aio *)nni_list_first(&udp->udp_sendq);
      if (aio == (nni_aio *)0x0) {
        return;
      }
    }
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,rv);
  } while( true );
}

Assistant:

static void
nni_posix_udp_doerror(nni_plat_udp *udp, int rv)
{
	nni_aio *aio;

	while (((aio = nni_list_first(&udp->udp_recvq)) != NULL) ||
	    ((aio = nni_list_first(&udp->udp_sendq)) != NULL)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, rv);
	}
}